

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O2

_Bool assert_base64_encode(char *input,char *expected)

{
  _Bool _Var1;
  int iVar2;
  size_t input_len;
  char *output;
  size_t __size;
  double dVar3;
  undefined1 auVar4 [16];
  
  input_len = strlen(input);
  auVar4._8_4_ = (int)(input_len >> 0x20);
  auVar4._0_8_ = input_len;
  auVar4._12_4_ = 0x45300000;
  dVar3 = ceil(((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)input_len) - 4503599627370496.0)) / 3.0);
  __size = (size_t)(int)(dVar3 * 4.0);
  output = (char *)calloc(1,__size);
  iVar2 = hdr_base64_encode((uint8_t *)input,input_len,output,__size);
  if (iVar2 == 0) {
    _Var1 = compare_string(expected,output,__size);
  }
  else {
    _Var1 = false;
  }
  free(output);
  return _Var1;
}

Assistant:

static bool assert_base64_encode(const char* input, const char* expected)
{
    size_t input_len = strlen(input);
    int output_len = (int) (ceil(input_len / 3.0) * 4.0);

    char* output = calloc(sizeof(char), output_len);

    int r = hdr_base64_encode((uint8_t*)input, input_len, output, output_len);
    bool result = r == 0 && compare_string(expected, output, output_len);

    free(output);

    return result;
}